

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependencyInfoParser.cpp
# Opt level: O1

void __thiscall llbuild::core::DependencyInfoParser::parse(DependencyInfoParser *this)

{
  byte bVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  _func_int **pp_Var2;
  long lVar3;
  byte *pbVar4;
  size_t sVar5;
  byte *pbVar6;
  byte *pbVar7;
  char *pcVar8;
  char *pcVar9;
  ParseActions *pPVar10;
  long lVar11;
  
  sVar5 = (this->data).Length;
  if ((sVar5 == 0) || ((this->data).Data[sVar5 - 1] != '\0')) {
    pPVar10 = this->actions;
    UNRECOVERED_JUMPTABLE = pPVar10->_vptr_ParseActions[2];
    pcVar8 = "missing null terminator";
  }
  else {
    pbVar7 = (byte *)(this->data).Data;
    if (*pbVar7 == 0) {
      pbVar6 = pbVar7 + sVar5;
      do {
        if (pbVar7 == pbVar6) {
          return;
        }
        bVar1 = *pbVar7;
        lVar11 = 0;
        pbVar4 = pbVar7 + 1;
        while (*pbVar4 != 0) {
          lVar11 = lVar11 + -1;
          pbVar4 = pbVar4 + 1;
          if (pbVar6 <= pbVar4) {
            __assert_fail("cur < end",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/DependencyInfoParser.cpp"
                          ,0x4f,"void llbuild::core::DependencyInfoParser::parse()");
          }
        }
        if (pbVar6 <= pbVar4) {
          __assert_fail("*operandEnd == \'\\x00\' && cur < end",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/DependencyInfoParser.cpp"
                        ,0x52,"void llbuild::core::DependencyInfoParser::parse()");
        }
        if (lVar11 == 0) {
          pPVar10 = this->actions;
          pcVar8 = (this->data).Data;
          pp_Var2 = pPVar10->_vptr_ParseActions;
          pcVar9 = "empty operand";
LAB_001499a8:
          (*pp_Var2[2])(pPVar10,pcVar9,(long)pbVar7 - (long)pcVar8);
        }
        else if (bVar1 < 0x11) {
          if (bVar1 == 0) {
            lVar3 = (long)pbVar7 - (long)(this->data).Data;
            if (lVar3 == 0) {
              (*this->actions->_vptr_ParseActions[3])();
            }
            else {
              (*this->actions->_vptr_ParseActions[2])
                        (this->actions,"invalid duplicate version",lVar3);
            }
          }
          else {
            if (bVar1 != 0x10) {
LAB_00149998:
              pPVar10 = this->actions;
              pcVar8 = (this->data).Data;
              pp_Var2 = pPVar10->_vptr_ParseActions;
              pcVar9 = "unknown opcode in file";
              goto LAB_001499a8;
            }
            (*this->actions->_vptr_ParseActions[4])();
          }
        }
        else if (bVar1 == 0x11) {
          (*this->actions->_vptr_ParseActions[6])(this->actions,pbVar7 + 1,-lVar11);
        }
        else {
          if (bVar1 != 0x40) goto LAB_00149998;
          (*this->actions->_vptr_ParseActions[5])();
        }
        pbVar7 = pbVar7 + (2 - lVar11);
        if (lVar11 == 0) {
          return;
        }
      } while( true );
    }
    pPVar10 = this->actions;
    UNRECOVERED_JUMPTABLE = pPVar10->_vptr_ParseActions[2];
    pcVar8 = "missing version record";
    sVar5 = 0;
  }
  (*UNRECOVERED_JUMPTABLE)(pPVar10,pcVar8,sVar5);
  return;
}

Assistant:

void DependencyInfoParser::parse() {
  // Validate that the file ends with a null byte, if not it is malformed and we
  // just bail on parsing.
  if (!data.endswith(StringRef("\0", 1))) {
    actions.error("missing null terminator", data.size());
    return;
  }

  // Validate that the file starts with the version record.
  if (Opcode(data[0]) != Opcode::Version) {
    actions.error("missing version record", 0);
    return;
  }

  // Parse the records in turn.
  const char* cur = data.begin();
  const char* end = data.end();
  while (cur != end) {
    const char* opcodeStart = cur;
    auto opcode = Opcode(*cur++);
    const char* operandStart = cur;
    while (*cur != '\0') {
      ++cur;
      // We require the file have a terminating null, so we can never scan past
      // the end.
      assert (cur < end);
    }
    const char* operandEnd = cur;
    assert(*operandEnd == '\x00' && cur < end);
    ++cur;

    // Diagnose empty operands (missing isn't possible.
    auto operand = StringRef(operandStart, operandEnd - operandStart);
    if (operand.empty()) {
      actions.error("empty operand", opcodeStart - data.data());
      break;
    }

    // Handle the opcode.
    switch (opcode) {
    case Opcode::Version: {
      // Diagnose duplicate version records.
      if (opcodeStart != data.begin()) {
        actions.error("invalid duplicate version", opcodeStart - data.data());
        break;
      }
      actions.actOnVersion(operand);
      break;
    }

    case Opcode::Input: {
      actions.actOnInput(operand);
      break;
    }

    case Opcode::Missing: {
      actions.actOnMissing(operand);
      break;
    }

    case Opcode::Output: {
      actions.actOnOutput(operand);
      break;
    }

    default:
      actions.error("unknown opcode in file", opcodeStart - data.data());
      break;
    }
  }
}